

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void mp_bezout_into(mp_int *a_coeff_out,mp_int *b_coeff_out,mp_int *gcd_out,mp_int *a_in,
                   mp_int *b_in)

{
  BignumInt *__src;
  byte bVar1;
  uint uVar2;
  mp_int *b;
  mp_int *a;
  mp_int *a_00;
  mp_int *a_01;
  mp_int *src1;
  mp_int *x;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  size_t nw;
  BignumInt BVar7;
  uint val;
  size_t bit;
  ulong uVar8;
  long lVar9;
  
  uVar5 = b_in->nw;
  if (b_in->nw < a_in->nw) {
    uVar5 = a_in->nw;
  }
  nw = uVar5 + (uVar5 == 0);
  b = mp_make_sized(nw);
  a = mp_make_sized(nw);
  uVar5 = a_in->nw;
  if (b->nw < a_in->nw) {
    uVar5 = b->nw;
  }
  memmove(b->w,a_in->w,uVar5 * 8);
  smemclr(b->w + uVar5,(b->nw - uVar5) * 8);
  uVar5 = b_in->nw;
  if (a->nw < b_in->nw) {
    uVar5 = a->nw;
  }
  memmove(a->w,b_in->w,uVar5 * 8);
  smemclr(a->w + uVar5,(a->nw - uVar5) * 8);
  a_00 = mp_make_sized(nw + 1);
  a_01 = mp_make_sized(nw + 1);
  src1 = mp_make_sized(nw);
  lVar9 = nw * 0x80;
  x = mp_make_sized(nw * 4 & 0x3fffffffffffffc);
  if (lVar9 != 0) {
    bit = 1;
    lVar3 = lVar9;
    do {
      uVar2 = mp_cmp_hs(a,b);
      uVar6 = (uint)*b->w;
      val = uVar6 & (uint)*a->w & 1;
      uVar6 = uVar6 & 1 ^ (uVar2 ^ uVar6) & val;
      mp_cond_swap(b,a,uVar6);
      BVar7 = -(ulong)val;
      mp_add_masked_into(b->w,b->nw,b,a,BVar7,BVar7,(ulong)((uint)BVar7 & 1));
      mp_rshift_fixed_into(b,b,1);
      mp_set_bit(x,bit - 1,val);
      mp_set_bit(x,bit,uVar6);
      bit = bit + 2;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  if (gcd_out != (mp_int *)0x0) {
    mp_add_masked_into(gcd_out->w,gcd_out->nw,b,a,0xffffffffffffffff,0,0);
  }
  if (a_coeff_out != (mp_int *)0x0 || b_coeff_out != (mp_int *)0x0) {
    uVar5 = b->nw;
    if (uVar5 == 0) {
      BVar7 = 0;
    }
    else {
      BVar7 = (BignumInt)((uint)*b->w & 1);
    }
    __src = a_00->w;
    *__src = BVar7;
    if (a->nw == 0) {
      BVar7 = 0;
    }
    else {
      BVar7 = (BignumInt)((uint)*a->w & 1);
    }
    *a_01->w = BVar7;
    uVar4 = a_00->nw;
    if (uVar5 < a_00->nw) {
      uVar4 = uVar5;
    }
    memmove(b->w,__src,uVar4 * 8);
    smemclr(b->w + uVar4,(b->nw - uVar4) * 8);
    uVar5 = a_01->nw;
    if (a->nw < a_01->nw) {
      uVar5 = a->nw;
    }
    memmove(a->w,a_01->w,uVar5 * 8);
    smemclr(a->w + uVar5,(a->nw - uVar5) * 8);
    uVar6 = (uint)*a->w;
    if (lVar9 != 0) {
      lVar9 = nw * -0x80;
      uVar5 = nw * 0x100;
      do {
        uVar5 = uVar5 - 2;
        if (uVar5 >> 6 < x->nw) {
          uVar4 = x->w[uVar5 >> 6];
          uVar2 = (uint)uVar5 & 0x3e;
          bVar1 = (byte)uVar2;
          uVar8 = (ulong)((uVar4 >> uVar2 & 1) != 0);
        }
        else {
          bVar1 = (byte)uVar5 & 0x3e;
          uVar8 = 0;
          uVar4 = 0;
        }
        uVar2 = (uint)((uVar4 >> (ulong)(bVar1 | 1) & 1) != 0);
        BVar7 = -(ulong)((uint)*a_00->w & 1);
        mp_add_masked_into(a_00->w,a_00->nw,a_00,a,BVar7,0,0);
        mp_add_masked_into(a_01->w,a_01->nw,a_01,b,BVar7,0,0);
        mp_rshift_fixed_into(a_00,a_00,1);
        mp_add_masked_into(a_01->w,a_01->nw,a_01,a_00,-uVar8,0,0);
        mp_lshift_fixed_into(b,b,1);
        mp_add_masked_into(b->w,b->nw,b,a,-uVar8,0,0);
        mp_cond_swap(b,a,uVar2);
        mp_cond_swap(a_00,a_01,uVar2);
        uVar6 = uVar6 ^ uVar2;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0);
    }
    mp_add_masked_into(src1->w,src1->nw,a,a_00,0xffffffffffffffff,0xffffffffffffffff,1);
    mp_select_into(a_00,a_00,src1,uVar6);
    mp_add_masked_into(src1->w,src1->nw,b,a_01,0xffffffffffffffff,0xffffffffffffffff,1);
    mp_select_into(a_01,a_01,src1,uVar6);
    if (a_coeff_out != (mp_int *)0x0) {
      uVar5 = a_00->nw;
      if (a_coeff_out->nw < a_00->nw) {
        uVar5 = a_coeff_out->nw;
      }
      memmove(a_coeff_out->w,a_00->w,uVar5 * 8);
      smemclr(a_coeff_out->w + uVar5,(a_coeff_out->nw - uVar5) * 8);
    }
    if (b_coeff_out != (mp_int *)0x0) {
      uVar5 = a_01->nw;
      if (b_coeff_out->nw < a_01->nw) {
        uVar5 = b_coeff_out->nw;
      }
      memmove(b_coeff_out->w,a_01->w,uVar5 * 8);
      smemclr(b_coeff_out->w + uVar5,(b_coeff_out->nw - uVar5) * 8);
    }
  }
  mp_free(b);
  mp_free(a);
  mp_free(a_00);
  mp_free(a_01);
  mp_free(src1);
  mp_free(x);
  return;
}

Assistant:

static void mp_bezout_into(mp_int *a_coeff_out, mp_int *b_coeff_out,
                           mp_int *gcd_out, mp_int *a_in, mp_int *b_in)
{
    size_t nw = size_t_max(1, size_t_max(a_in->nw, b_in->nw));

    /* Make mutable copies of the input numbers */
    mp_int *a = mp_make_sized(nw), *b = mp_make_sized(nw);
    mp_copy_into(a, a_in);
    mp_copy_into(b, b_in);

    /* Space to build up the output coefficients, with an extra word
     * so that intermediate values can overflow off the top and still
     * right-shift back down to the correct value */
    mp_int *ac = mp_make_sized(nw + 1), *bc = mp_make_sized(nw + 1);

    /* And a general-purpose temp register */
    mp_int *tmp = mp_make_sized(nw);

    /* Space to record the sequence of reduction steps to unwind. We
     * make it a BignumInt for no particular reason except that (a)
     * mp_make_sized conveniently zeroes the allocation and mp_free
     * wipes it, and (b) this way I can use mp_dump() if I have to
     * debug this code. */
    size_t steps = 2 * nw * BIGNUM_INT_BITS;
    mp_int *record = mp_make_sized(
        (steps*2 + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS);

    for (size_t step = 0; step < steps; step++) {
        /*
         * If a and b are both odd, we want to sort them so that a is
         * larger. But if one is even, we want to sort them so that a
         * is the even one.
         */
        unsigned swap_if_both_odd = mp_cmp_hs(b, a);
        unsigned swap_if_one_even = a->w[0] & 1;
        unsigned both_odd = a->w[0] & b->w[0] & 1;
        unsigned swap = swap_if_one_even ^ (
            (swap_if_both_odd ^ swap_if_one_even) & both_odd);

        mp_cond_swap(a, b, swap);

        /*
         * If a,b are both odd, then a is the larger number, so
         * subtract the smaller one from it.
         */
        mp_cond_sub_into(a, a, b, both_odd);

        /*
         * Now a is even, so divide it by two.
         */
        mp_rshift_fixed_into(a, a, 1);

        /*
         * Record the two 1-bit values both_odd and swap.
         */
        mp_set_bit(record, step*2, both_odd);
        mp_set_bit(record, step*2+1, swap);
    }

    /*
     * Now we expect to have reduced the two numbers to 0 and d,
     * although we don't know which way round. (But we avoid checking
     * this by assertion; sometimes we'll need to do this computation
     * without giving away that we already know the inputs were bogus.
     * So we'd prefer to just press on and return nonsense.)
     */

    if (gcd_out) {
        /*
         * At this point we can return the actual gcd. Since one of
         * a,b is it and the other is zero, the easiest way to get it
         * is to add them together.
         */
        mp_add_into(gcd_out, a, b);
    }

    /*
     * If the caller _only_ wanted the gcd, and neither Bezout
     * coefficient is even required, we can skip the entire unwind
     * stage.
     */
    if (a_coeff_out || b_coeff_out) {

        /*
         * The Bezout coefficients of a,b at this point are simply 0
         * for whichever of a,b is zero, and 1 for whichever is
         * nonzero. The nonzero number equals gcd(a,b), which by
         * assumption is odd, so we can do this by just taking the low
         * bit of each one.
         */
        ac->w[0] = mp_get_bit(a, 0);
        bc->w[0] = mp_get_bit(b, 0);

        /*
         * Overwrite a,b themselves with those same numbers. This has
         * the effect of dividing both of them by d, which will
         * arrange that during the unwind stage we generate the
         * minimal coefficients instead of a larger pair.
         */
        mp_copy_into(a, ac);
        mp_copy_into(b, bc);

        /*
         * We'll maintain the invariant as we unwind that ac * a - bc
         * * b is either +d or -d (or rather, +1/-1 after scaling by
         * d), and we'll remember which. (We _could_ keep it at +d the
         * whole time, but it would cost more work every time round
         * the loop, so it's cheaper to fix that up once at the end.)
         *
         * Initially, the result is +d if a was the nonzero value after
         * reduction, and -d if b was.
         */
        unsigned minus_d = b->w[0];

        for (size_t step = steps; step-- > 0 ;) {
            /*
             * Recover the data from the step we're unwinding.
             */
            unsigned both_odd = mp_get_bit(record, step*2);
            unsigned swap = mp_get_bit(record, step*2+1);

            /*
             * Unwind the division: if our coefficient of a is odd, we
             * adjust the coefficients by +b and +a respectively.
             */
            unsigned adjust = ac->w[0] & 1;
            mp_cond_add_into(ac, ac, b, adjust);
            mp_cond_add_into(bc, bc, a, adjust);

            /*
             * Now ac is definitely even, so we divide it by two.
             */
            mp_rshift_fixed_into(ac, ac, 1);

            /*
             * Now unwind the subtraction, if there was one, by adding
             * ac to bc.
             */
            mp_cond_add_into(bc, bc, ac, both_odd);

            /*
             * Undo the transformation of the input numbers, by
             * multiplying a by 2 and then adding b to a (the latter
             * only if both_odd).
             */
            mp_lshift_fixed_into(a, a, 1);
            mp_cond_add_into(a, a, b, both_odd);

            /*
             * Finally, undo the swap. If we do swap, this also
             * reverses the sign of the current result ac*a+bc*b.
             */
            mp_cond_swap(a, b, swap);
            mp_cond_swap(ac, bc, swap);
            minus_d ^= swap;
        }

        /*
         * Now we expect to have recovered the input a,b (or rather,
         * the versions of them divided by d). But we might find that
         * our current result is -d instead of +d, that is, we have
         * A',B' such that A'a - B'b = -d.
         *
         * In that situation, we set A = b-A' and B = a-B', giving us
         * Aa-Bb = ab - A'a - ab + B'b = +1.
         */
        mp_sub_into(tmp, b, ac);
        mp_select_into(ac, ac, tmp, minus_d);
        mp_sub_into(tmp, a, bc);
        mp_select_into(bc, bc, tmp, minus_d);

        /*
         * Now we really are done. Return the outputs.
         */
        if (a_coeff_out)
            mp_copy_into(a_coeff_out, ac);
        if (b_coeff_out)
            mp_copy_into(b_coeff_out, bc);

    }

    mp_free(a);
    mp_free(b);
    mp_free(ac);
    mp_free(bc);
    mp_free(tmp);
    mp_free(record);
}